

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TSymbol * __thiscall
glslang::TParseContext::redeclareBuiltinVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TQualifier *qualifier,
          TShaderQualifiers *publicType)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  TIntermediate *pTVar19;
  TString *pTVar20;
  bool bVar21;
  bool bVar22;
  int iVar23;
  uint uVar24;
  long *plVar25;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar26;
  char *pcVar27;
  long lVar28;
  bool local_131;
  byte local_f4;
  byte local_f3;
  bool local_f2;
  bool local_f1;
  pool_allocator<char> local_e8;
  TString local_e0;
  pool_allocator<char> local_b8;
  TString local_b0;
  byte local_81;
  pool_allocator<char> local_80;
  TString local_78;
  long local_50;
  TQualifier *symbolQualifier;
  TSymbol *symbol;
  bool builtIn;
  bool ssoPre150;
  bool esRedecls;
  TShaderQualifiers *pTStack_38;
  bool nonEsRedecls;
  TShaderQualifiers *publicType_local;
  TQualifier *qualifier_local;
  TString *identifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  pTStack_38 = publicType;
  publicType_local = (TShaderQualifiers *)qualifier;
  qualifier_local = (TQualifier *)identifier;
  identifier_local = (TString *)loc;
  loc_local = (TSourceLoc *)this;
  bVar21 = builtInName(this,identifier);
  if (((!bVar21) ||
      (bVar21 = TSymbolTable::atBuiltInLevel((this->super_TParseContextBase).symbolTable), bVar21))
     || (bVar21 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable), !bVar21)
     ) {
    return (TSymbol *)0x0;
  }
  bVar21 = TParseVersions::isEsProfile((TParseVersions *)this);
  local_f1 = false;
  if (!bVar21) {
    local_f2 = true;
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x82) {
      local_f2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)qualifier_local,"gl_TexCoord");
    }
    local_f1 = local_f2;
  }
  symbol._7_1_ = local_f1;
  bVar21 = TParseVersions::isEsProfile((TParseVersions *)this);
  local_f3 = 0;
  if (bVar21) {
    local_f4 = 1;
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x140) {
      iVar23 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[9])
                         (this,2,AEP_shader_io_blocks);
      local_f4 = (byte)iVar23;
    }
    local_f3 = local_f4;
  }
  symbol._6_1_ = local_f3 & 1;
  if ((symbol._6_1_ == 0) && ((symbol._7_1_ & 1) == 0)) {
    return (TSymbol *)0x0;
  }
  symbol._5_1_ = 0;
  bVar21 = TParseVersions::isEsProfile((TParseVersions *)this);
  if (((!bVar21) && ((this->super_TParseContextBase).super_TParseVersions.version < 0x8d)) &&
     ((uVar24 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_ARB_separate_shader_objects"), (uVar24 & 1) != 0 &&
      ((((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_Position"), bVar21 ||
         (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_PointSize"), bVar21)) ||
        (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)qualifier_local,"gl_ClipVertex"), bVar21)) ||
       (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)qualifier_local,"gl_FogFragCoord"), bVar21)))))) {
    symbol._5_1_ = 1;
  }
  if (((symbol._5_1_ & 1) == 0) &&
     ((((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)qualifier_local,"gl_FragDepth"), !bVar21 ||
        ((((symbol._7_1_ & 1) == 0 ||
          ((this->super_TParseContextBase).super_TParseVersions.version < 0x1a4)) &&
         ((symbol._6_1_ & 1) == 0)))) &&
       (((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_FragCoord"), !bVar21 ||
         ((((symbol._7_1_ & 1) == 0 ||
           ((this->super_TParseContextBase).super_TParseVersions.version < 0x8c)) &&
          ((symbol._6_1_ & 1) == 0)))) &&
        (((((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)qualifier_local,"gl_ClipDistance"), !bVar21 &&
            (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)qualifier_local,"gl_CullDistance"), !bVar21)) &&
           (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)qualifier_local,"gl_ShadingRateEXT"), !bVar21)) &&
          ((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)qualifier_local,"gl_PrimitiveShadingRateEXT"), !bVar21 &&
           (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)qualifier_local,"gl_FrontColor"), !bVar21)))) &&
         (((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)qualifier_local,"gl_BackColor"), !bVar21 &&
           ((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)qualifier_local,"gl_FrontSecondaryColor"), !bVar21 &&
            (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)qualifier_local,"gl_BackSecondaryColor"), !bVar21)))) &&
          (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)qualifier_local,"gl_SecondaryColor"), !bVar21)))))))) &&
      (((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)qualifier_local,"gl_Color"), !bVar21 ||
        ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment)) &&
       (((((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)qualifier_local,"gl_FragStencilRefARB"), !bVar21 ||
           ((((symbol._7_1_ & 1) == 0 ||
             ((this->super_TParseContextBase).super_TParseVersions.version < 0x8c)) ||
            ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment)))) &&
          (((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)qualifier_local,"gl_SampleMask"), !bVar21 &&
            (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)qualifier_local,"gl_Layer"), !bVar21)) &&
           (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)qualifier_local,"gl_PrimitiveIndicesNV"), !bVar21)))) &&
         ((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)qualifier_local,"gl_PrimitivePointIndicesEXT"), !bVar21 &&
          (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)qualifier_local,"gl_PrimitiveLineIndicesEXT"), !bVar21)))) &&
        ((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_PrimitiveTriangleIndicesEXT"), !bVar21 &&
         (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_TexCoord"), !bVar21)))))))))) {
    return (TSymbol *)0x0;
  }
  symbolQualifier =
       (TQualifier *)
       TSymbolTable::find((this->super_TParseContextBase).symbolTable,(TString *)qualifier_local,
                          (bool *)((long)&symbol + 4),(bool *)0x0,(int *)0x0);
  if (symbolQualifier == (TQualifier *)0x0) {
    return (TSymbol *)0x0;
  }
  if ((symbol._4_1_ & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4e])
              (this,&symbolQualifier);
    TSymbolTable::amendSymbolIdLevel
              ((this->super_TParseContextBase).symbolTable,(TSymbol *)symbolQualifier);
  }
  plVar25 = (long *)(**(code **)(symbolQualifier->semanticName + 0x68))();
  local_50 = (**(code **)(*plVar25 + 0x50))();
  if ((symbol._5_1_ & 1) == 0) {
    bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)qualifier_local,"gl_FrontColor");
    if (((((bVar21) ||
          (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)qualifier_local,"gl_BackColor"), bVar21)) ||
         (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_FrontSecondaryColor"), bVar21)) ||
        ((bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_BackSecondaryColor"), bVar21 ||
         (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_SecondaryColor"), bVar21)))) ||
       (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)qualifier_local,"gl_Color"), bVar21)) {
      *(ulong *)(local_50 + 8) =
           *(ulong *)(local_50 + 8) & 0xffffffff7fffffff |
           (ulong)(publicType_local->invocations & 0x80000000);
      *(ulong *)(local_50 + 8) =
           *(ulong *)(local_50 + 8) & 0xffffffffbfffffff |
           (ulong)(publicType_local->invocations & 0x40000000);
      uVar10._0_4_ = publicType_local->invocations;
      uVar10._4_4_ = publicType_local->vertices;
      *(ulong *)(local_50 + 8) =
           *(ulong *)(local_50 + 8) & 0xffffffdfffffffff |
           (ulong)((byte)(uVar10 >> 0x25) & 1) << 0x25;
      bVar21 = TQualifier::hasLayout((TQualifier *)publicType_local);
      pTVar20 = identifier_local;
      if (bVar21) {
        pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(symbolQualifier->semanticName + 0x18))();
        pcVar27 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            (pbVar26);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar20,"cannot apply layout qualifier to","redeclaration",pcVar27);
      }
      bVar21 = TQualifier::isMemory((TQualifier *)publicType_local);
      if ((!bVar21) && (bVar21 = TQualifier::isAuxiliary((TQualifier *)publicType_local), !bVar21))
      {
        plVar25 = (long *)(**(code **)(symbolQualifier->semanticName + 0x60))();
        lVar28 = (**(code **)(*plVar25 + 0x58))();
        uVar3 = publicType_local->invocations;
        if (((uint)*(undefined8 *)(lVar28 + 8) & 0x7f) == (uVar3 & 0x7f)) {
          return (TSymbol *)symbolQualifier;
        }
      }
      pTVar20 = identifier_local;
      pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(symbolQualifier->semanticName + 0x18))();
      pcVar27 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (pbVar26);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar20,"cannot change storage, memory, or auxiliary qualification of",
                 "redeclaration",pcVar27);
    }
    else {
      bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                *)qualifier_local,"gl_TexCoord");
      if (((bVar21) ||
          (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)qualifier_local,"gl_ClipDistance"), bVar21)) ||
         (bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_CullDistance"), bVar21)) {
        bVar21 = TQualifier::hasLayout((TQualifier *)publicType_local);
        if ((((bVar21) || (bVar21 = TQualifier::isMemory((TQualifier *)publicType_local), bVar21))
            || ((bVar21 = TQualifier::isAuxiliary((TQualifier *)publicType_local), bVar21 ||
                ((uVar11._0_4_ = publicType_local->invocations,
                 uVar11._4_4_ = publicType_local->vertices,
                 ((byte)(uVar11 >> 0x25) & 1) != ((byte)(*(ulong *)(local_50 + 8) >> 0x25) & 1) ||
                 (uVar12._0_4_ = publicType_local->invocations,
                 uVar12._4_4_ = publicType_local->vertices,
                 ((byte)(uVar12 >> 0x1f) & 1) != ((byte)(*(ulong *)(local_50 + 8) >> 0x1f) & 1))))))
            ) || (uVar4 = publicType_local->invocations,
                 ((uint)*(undefined8 *)(local_50 + 8) & 0x7f) != (uVar4 & 0x7f))) {
          pTVar20 = identifier_local;
          pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(symbolQualifier->semanticName + 0x18))();
          pcVar27 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(pbVar26);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar20,"cannot change qualification of","redeclaration",pcVar27);
        }
      }
      else {
        bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)qualifier_local,"gl_FragCoord");
        if (bVar21) {
          bVar21 = TIntermediate::getTexCoordRedeclared
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate);
          local_81 = 0;
          local_131 = false;
          if (!bVar21) {
            pTVar19 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pool_allocator<char>::pool_allocator(&local_80);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_78,"gl_FragCoord",&local_80);
            local_81 = 1;
            local_131 = TIntermediate::inIoAccessed(pTVar19,&local_78);
          }
          if ((local_81 & 1) != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_78);
          }
          if (local_131 != false) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,identifier_local,"cannot redeclare after use","gl_FragCoord","");
          }
          uVar13._0_4_ = publicType_local->invocations;
          uVar13._4_4_ = publicType_local->vertices;
          if ((((((byte)(uVar13 >> 0x25) & 1) != ((byte)(*(ulong *)(local_50 + 8) >> 0x25) & 1)) ||
               (uVar14._0_4_ = publicType_local->invocations,
               uVar14._4_4_ = publicType_local->vertices,
               ((byte)(uVar14 >> 0x1f) & 1) != ((byte)(*(ulong *)(local_50 + 8) >> 0x1f) & 1))) ||
              (bVar21 = TQualifier::isMemory((TQualifier *)publicType_local), bVar21)) ||
             (bVar21 = TQualifier::isAuxiliary((TQualifier *)publicType_local), bVar21)) {
            pTVar20 = identifier_local;
            pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(symbolQualifier->semanticName + 0x18))();
            pcVar27 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar26);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar20,"can only change layout qualification of","redeclaration",
                       pcVar27);
          }
          pTVar20 = identifier_local;
          uVar5 = publicType_local->invocations;
          if ((uVar5 & 0x7f) != 3) {
            pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(symbolQualifier->semanticName + 0x18))();
            pcVar27 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar26);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar20,"cannot change input storage qualification of","redeclaration",
                       pcVar27);
          }
          if (((symbol._4_1_ & 1) == 0) &&
             ((bVar21 = pTStack_38->pixelCenterInteger,
              bVar22 = TIntermediate::getPixelCenterInteger
                                 ((this->super_TParseContextBase).super_TParseVersions.intermediate)
              , (bool)(bVar21 & 1U) != bVar22 ||
              (bVar21 = pTStack_38->originUpperLeft,
              bVar22 = TIntermediate::getOriginUpperLeft
                                 ((this->super_TParseContextBase).super_TParseVersions.intermediate)
              , (bool)(bVar21 & 1U) != bVar22)))) {
            pTVar20 = identifier_local;
            pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(symbolQualifier->semanticName + 0x18))();
            pcVar27 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str(pbVar26);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar20,"cannot redeclare with different qualification:","redeclaration"
                       ,pcVar27);
          }
          TIntermediate::setTexCoordRedeclared
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate);
          if ((pTStack_38->pixelCenterInteger & 1U) != 0) {
            TIntermediate::setPixelCenterInteger
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
          }
          if ((pTStack_38->originUpperLeft & 1U) != 0) {
            TIntermediate::setOriginUpperLeft
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
          }
        }
        else {
          bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)qualifier_local,"gl_FragDepth");
          if (bVar21) {
            uVar15._0_4_ = publicType_local->invocations;
            uVar15._4_4_ = publicType_local->vertices;
            if (((((byte)(uVar15 >> 0x25) & 1) != ((byte)(*(ulong *)(local_50 + 8) >> 0x25) & 1)) ||
                (uVar16._0_4_ = publicType_local->invocations,
                uVar16._4_4_ = publicType_local->vertices,
                ((byte)(uVar16 >> 0x1f) & 1) != ((byte)(*(ulong *)(local_50 + 8) >> 0x1f) & 1))) ||
               ((bVar21 = TQualifier::isMemory((TQualifier *)publicType_local), bVar21 ||
                (bVar21 = TQualifier::isAuxiliary((TQualifier *)publicType_local), bVar21)))) {
              pTVar20 = identifier_local;
              pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(symbolQualifier->semanticName + 0x18))();
              pcVar27 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str(pbVar26);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,pTVar20,"can only change layout qualification of","redeclaration",
                         pcVar27);
            }
            pTVar20 = identifier_local;
            uVar6 = publicType_local->invocations;
            if ((uVar6 & 0x7f) != 4) {
              pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(symbolQualifier->semanticName + 0x18))();
              pcVar27 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        c_str(pbVar26);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,pTVar20,"cannot change output storage qualification of",
                         "redeclaration",pcVar27);
            }
            if (pTStack_38->layoutDepth != EldNone) {
              pTVar19 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              pool_allocator<char>::pool_allocator(&local_b8);
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         &local_b0,"gl_FragDepth",&local_b8);
              bVar21 = TIntermediate::inIoAccessed(pTVar19,&local_b0);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_b0);
              if (bVar21) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,identifier_local,"cannot redeclare after use","gl_FragDepth","");
              }
              bVar21 = TIntermediate::setDepth
                                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                  pTStack_38->layoutDepth);
              pTVar20 = identifier_local;
              if (!bVar21) {
                pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(symbolQualifier->semanticName + 0x18))();
                pcVar27 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str(pbVar26);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,pTVar20,"all redeclarations must use the same depth layout on",
                           "redeclaration",pcVar27);
              }
            }
          }
          else {
            bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)qualifier_local,"gl_FragStencilRefARB");
            if (bVar21) {
              uVar17._0_4_ = publicType_local->invocations;
              uVar17._4_4_ = publicType_local->vertices;
              if ((((((byte)(uVar17 >> 0x25) & 1) != ((byte)(*(ulong *)(local_50 + 8) >> 0x25) & 1))
                   || (uVar18._0_4_ = publicType_local->invocations,
                      uVar18._4_4_ = publicType_local->vertices,
                      ((byte)(uVar18 >> 0x1f) & 1) != ((byte)(*(ulong *)(local_50 + 8) >> 0x1f) & 1)
                      )) || (bVar21 = TQualifier::isMemory((TQualifier *)publicType_local), bVar21))
                 || (bVar21 = TQualifier::isAuxiliary((TQualifier *)publicType_local), bVar21)) {
                pTVar20 = identifier_local;
                pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(symbolQualifier->semanticName + 0x18))();
                pcVar27 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str(pbVar26);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,pTVar20,"can only change layout qualification of","redeclaration",
                           pcVar27);
              }
              pTVar20 = identifier_local;
              uVar7 = publicType_local->invocations;
              if ((uVar7 & 0x7f) != 4) {
                pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(symbolQualifier->semanticName + 0x18))();
                pcVar27 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::c_str(pbVar26);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,pTVar20,"cannot change output storage qualification of",
                           "redeclaration",pcVar27);
              }
              if (pTStack_38->layoutStencil != ElsNone) {
                pTVar19 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                pool_allocator<char>::pool_allocator(&local_e8);
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                basic_string<glslang::std::allocator<char>>
                          ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                            *)&local_e0,"gl_FragStencilRefARB",&local_e8);
                bVar21 = TIntermediate::inIoAccessed(pTVar19,&local_e0);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                ~basic_string(&local_e0);
                if (bVar21) {
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,identifier_local,"cannot redeclare after use",
                             "gl_FragStencilRefARB","");
                }
                bVar21 = TIntermediate::setStencil
                                   ((this->super_TParseContextBase).super_TParseVersions.
                                    intermediate,pTStack_38->layoutStencil);
                pTVar20 = identifier_local;
                if (!bVar21) {
                  pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)(**(code **)(symbolQualifier->semanticName + 0x18))();
                  pcVar27 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::c_str(pbVar26);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,pTVar20,"all redeclarations must use the same stencil layout on",
                             "redeclaration",pcVar27);
                }
              }
            }
            else {
              bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        *)qualifier_local,"gl_PrimitiveIndicesNV");
              if (bVar21) {
                bVar21 = TQualifier::hasLayout((TQualifier *)publicType_local);
                pTVar20 = identifier_local;
                if (bVar21) {
                  pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)(**(code **)(symbolQualifier->semanticName + 0x18))();
                  pcVar27 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::c_str(pbVar26);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,pTVar20,"cannot apply layout qualifier to","redeclaration",pcVar27
                            );
                }
                pTVar20 = identifier_local;
                uVar8 = publicType_local->invocations;
                if ((uVar8 & 0x7f) != 4) {
                  pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)(**(code **)(symbolQualifier->semanticName + 0x18))();
                  pcVar27 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::c_str(pbVar26);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,pTVar20,"cannot change output storage qualification of",
                             "redeclaration",pcVar27);
                }
              }
              else {
                bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          *)qualifier_local,"gl_SampleMask");
                pTVar20 = identifier_local;
                if (bVar21) {
                  if ((pTStack_38->layoutOverrideCoverage & 1U) == 0) {
                    pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)(**(code **)(symbolQualifier->semanticName + 0x18))();
                    pcVar27 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::c_str(pbVar26);
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,pTVar20,"redeclaration only allowed for override_coverage layout"
                              ,"redeclaration",pcVar27);
                  }
                  TIntermediate::setLayoutOverrideCoverage
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate);
                }
                else {
                  bVar21 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            *)qualifier_local,"gl_Layer");
                  pTVar20 = identifier_local;
                  if (bVar21) {
                    if (((publicType_local->localSizeSpecId[1] & 1) == 0) &&
                       (publicType_local->localSizeSpecId[2] == -0x800)) {
                      pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)(**(code **)(symbolQualifier->semanticName + 0x18))();
                      pcVar27 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::c_str(pbVar26);
                      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                        [0x2d])(this,pTVar20,
                                "redeclaration only allowed for viewport_relative or secondary_view_offset layout"
                                ,"redeclaration",pcVar27);
                    }
                    *(byte *)(local_50 + 0x30) = (byte)publicType_local->localSizeSpecId[1] & 1;
                    *(int *)(local_50 + 0x34) = publicType_local->localSizeSpecId[2];
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    bVar21 = TIntermediate::inIoAccessed
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (TString *)qualifier_local);
    pTVar20 = identifier_local;
    if (bVar21) {
      pcVar27 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)qualifier_local);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar20,"cannot redeclare after use",pcVar27,"");
    }
    bVar21 = TQualifier::hasLayout((TQualifier *)publicType_local);
    pTVar20 = identifier_local;
    if (bVar21) {
      pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(symbolQualifier->semanticName + 0x18))();
      pcVar27 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (pbVar26);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar20,"cannot apply layout qualifier to","redeclaration",pcVar27);
    }
    bVar21 = TQualifier::isMemory((TQualifier *)publicType_local);
    if ((((bVar21) || (bVar21 = TQualifier::isAuxiliary((TQualifier *)publicType_local), bVar21)) ||
        (((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex &&
         (uVar1 = publicType_local->invocations, (uVar1 & 0x7f) != 4)))) ||
       (((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment &&
        (uVar2 = publicType_local->invocations, (uVar2 & 0x7f) != 3)))) {
      pTVar20 = identifier_local;
      pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(symbolQualifier->semanticName + 0x18))();
      pcVar27 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (pbVar26);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar20,"cannot change storage, memory, or auxiliary qualification of",
                 "redeclaration",pcVar27);
    }
    pTVar20 = identifier_local;
    uVar9._0_4_ = publicType_local->invocations;
    uVar9._4_4_ = publicType_local->vertices;
    if ((uVar9 >> 0x1e & 1) == 0) {
      pbVar26 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(symbolQualifier->semanticName + 0x18))();
      pcVar27 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (pbVar26);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar20,"cannot change interpolation qualification of","redeclaration",pcVar27
                );
    }
  }
  return (TSymbol *)symbolQualifier;
}

Assistant:

TSymbol* TParseContext::redeclareBuiltinVariable(const TSourceLoc& loc, const TString& identifier,
                                                 const TQualifier& qualifier, const TShaderQualifiers& publicType)
{
    if (! builtInName(identifier) || symbolTable.atBuiltInLevel() || ! symbolTable.atGlobalLevel())
        return nullptr;

    bool nonEsRedecls = (!isEsProfile() && (version >= 130 || identifier == "gl_TexCoord"));
    bool    esRedecls = (isEsProfile() &&
                         (version >= 320 || extensionsTurnedOn(Num_AEP_shader_io_blocks, AEP_shader_io_blocks)));
    if (! esRedecls && ! nonEsRedecls)
        return nullptr;

    // Special case when using GL_ARB_separate_shader_objects
    bool ssoPre150 = false;  // means the only reason this variable is redeclared is due to this combination
    if (!isEsProfile() && version <= 140 && extensionTurnedOn(E_GL_ARB_separate_shader_objects)) {
        if (identifier == "gl_Position"     ||
            identifier == "gl_PointSize"    ||
            identifier == "gl_ClipVertex"   ||
            identifier == "gl_FogFragCoord")
            ssoPre150 = true;
    }

    // Potentially redeclaring a built-in variable...

    if (ssoPre150 ||
        (identifier == "gl_FragDepth"           && ((nonEsRedecls && version >= 420) || esRedecls)) ||
        (identifier == "gl_FragCoord"           && ((nonEsRedecls && version >= 140) || esRedecls)) ||
         identifier == "gl_ClipDistance"                                                            ||
         identifier == "gl_CullDistance"                                                            ||
         identifier == "gl_ShadingRateEXT"                                                          ||
         identifier == "gl_PrimitiveShadingRateEXT"                                                 ||
         identifier == "gl_FrontColor"                                                              ||
         identifier == "gl_BackColor"                                                               ||
         identifier == "gl_FrontSecondaryColor"                                                     ||
         identifier == "gl_BackSecondaryColor"                                                      ||
         identifier == "gl_SecondaryColor"                                                          ||
        (identifier == "gl_Color"               && language == EShLangFragment)                     ||
        (identifier == "gl_FragStencilRefARB"   && (nonEsRedecls && version >= 140)
                                                && language == EShLangFragment)                     ||
         identifier == "gl_SampleMask"                                                              ||
         identifier == "gl_Layer"                                                                   ||
         identifier == "gl_PrimitiveIndicesNV"                                                      ||
         identifier == "gl_PrimitivePointIndicesEXT"                                                ||
         identifier == "gl_PrimitiveLineIndicesEXT"                                                 ||
         identifier == "gl_PrimitiveTriangleIndicesEXT"                                             ||
         identifier == "gl_TexCoord") {

        // Find the existing symbol, if any.
        bool builtIn;
        TSymbol* symbol = symbolTable.find(identifier, &builtIn);

        // If the symbol was not found, this must be a version/profile/stage
        // that doesn't have it.
        if (! symbol)
            return nullptr;

        // If it wasn't at a built-in level, then it's already been redeclared;
        // that is, this is a redeclaration of a redeclaration; reuse that initial
        // redeclaration.  Otherwise, make the new one.
        if (builtIn) {
            makeEditable(symbol);
            symbolTable.amendSymbolIdLevel(*symbol);
        }

        // Now, modify the type of the copy, as per the type of the current redeclaration.

        TQualifier& symbolQualifier = symbol->getWritableType().getQualifier();
        if (ssoPre150) {
            if (intermediate.inIoAccessed(identifier))
                error(loc, "cannot redeclare after use", identifier.c_str(), "");
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.isMemory() || qualifier.isAuxiliary() || (language == EShLangVertex   && qualifier.storage != EvqVaryingOut) ||
                                                                   (language == EShLangFragment && qualifier.storage != EvqVaryingIn))
                error(loc, "cannot change storage, memory, or auxiliary qualification of", "redeclaration", symbol->getName().c_str());
            if (! qualifier.smooth)
                error(loc, "cannot change interpolation qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_FrontColor"          ||
                   identifier == "gl_BackColor"           ||
                   identifier == "gl_FrontSecondaryColor" ||
                   identifier == "gl_BackSecondaryColor"  ||
                   identifier == "gl_SecondaryColor"      ||
                   identifier == "gl_Color") {
            symbolQualifier.flat = qualifier.flat;
            symbolQualifier.smooth = qualifier.smooth;
            symbolQualifier.nopersp = qualifier.nopersp;
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.isMemory() || qualifier.isAuxiliary() || symbol->getType().getQualifier().storage != qualifier.storage)
                error(loc, "cannot change storage, memory, or auxiliary qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_TexCoord"     ||
                   identifier == "gl_ClipDistance" ||
                   identifier == "gl_CullDistance") {
            if (qualifier.hasLayout() || qualifier.isMemory() || qualifier.isAuxiliary() ||
                qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                symbolQualifier.storage != qualifier.storage)
                error(loc, "cannot change qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_FragCoord") {
            if (!intermediate.getTexCoordRedeclared() && intermediate.inIoAccessed("gl_FragCoord"))
                error(loc, "cannot redeclare after use", "gl_FragCoord", "");
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingIn)
                error(loc, "cannot change input storage qualification of", "redeclaration", symbol->getName().c_str());
            if (! builtIn && (publicType.pixelCenterInteger != intermediate.getPixelCenterInteger() ||
                              publicType.originUpperLeft != intermediate.getOriginUpperLeft()))
                error(loc, "cannot redeclare with different qualification:", "redeclaration", symbol->getName().c_str());


            intermediate.setTexCoordRedeclared();
            if (publicType.pixelCenterInteger)
                intermediate.setPixelCenterInteger();
            if (publicType.originUpperLeft)
                intermediate.setOriginUpperLeft();
        } else if (identifier == "gl_FragDepth") {
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
            if (publicType.layoutDepth != EldNone) {
                if (intermediate.inIoAccessed("gl_FragDepth"))
                    error(loc, "cannot redeclare after use", "gl_FragDepth", "");
                if (! intermediate.setDepth(publicType.layoutDepth))
                    error(loc, "all redeclarations must use the same depth layout on", "redeclaration", symbol->getName().c_str());
            }
        } else if (identifier == "gl_FragStencilRefARB") {
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
            if (publicType.layoutStencil != ElsNone) {
                if (intermediate.inIoAccessed("gl_FragStencilRefARB"))
                    error(loc, "cannot redeclare after use", "gl_FragStencilRefARB", "");
                if (!intermediate.setStencil(publicType.layoutStencil))
                    error(loc, "all redeclarations must use the same stencil layout on", "redeclaration",
                          symbol->getName().c_str());
            }
        }
        else if (
            identifier == "gl_PrimitiveIndicesNV") {
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
        }
        else if (identifier == "gl_SampleMask") {
            if (!publicType.layoutOverrideCoverage) {
                error(loc, "redeclaration only allowed for override_coverage layout", "redeclaration", symbol->getName().c_str());
            }
            intermediate.setLayoutOverrideCoverage();
        }
        else if (identifier == "gl_Layer") {
            if (!qualifier.layoutViewportRelative && qualifier.layoutSecondaryViewportRelativeOffset == -2048)
                error(loc, "redeclaration only allowed for viewport_relative or secondary_view_offset layout", "redeclaration", symbol->getName().c_str());
            symbolQualifier.layoutViewportRelative = qualifier.layoutViewportRelative;
            symbolQualifier.layoutSecondaryViewportRelativeOffset = qualifier.layoutSecondaryViewportRelativeOffset;
        }

        // TODO: semantics quality: separate smooth from nothing declared, then use IsInterpolation for several tests above

        return symbol;
    }

    return nullptr;
}